

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O3

Parent * __thiscall
kj::_::BTreeImpl::eraseHelper<kj::_::BTreeImpl::Parent>
          (BTreeImpl *this,Parent *node,Parent *parent,uint indexInParent,uint pos,MaybeUint **fixup
          )

{
  MaybeUint *pMVar1;
  Parent *pPVar2;
  undefined8 *puVar3;
  uint uVar4;
  uint uVar5;
  NodeUnion *pNVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  bool bVar17;
  Fault f;
  Fault local_38;
  
  if (parent == (Parent *)0x0) {
    return node;
  }
  if (node->keys[3].i != 0) {
    return node;
  }
  if (indexInParent == 0) {
    uVar4 = parent->keys[0].i;
    if (uVar4 == 0) {
      Debug::Fault::Fault<kj::Exception::Type,char_const(&)[20]>
                (&local_38,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.c++"
                 ,0x236,FAILED,(char *)0x0,"\"inconsistent b-tree\"",
                 (char (*) [20])"inconsistent b-tree");
      Debug::Fault::fatal(&local_38);
    }
    pMVar1 = parent->keys;
    uVar15 = parent->children[1];
    pNVar6 = this->tree;
    uVar5 = pNVar6[uVar15].field_0.freelist.zero[3];
    node->keys[3].i = uVar4;
    if (uVar5 != 0) {
      if (*fixup == pMVar1) {
        *fixup = node->keys + 3;
      }
      pMVar1->i = pNVar6[uVar15].field_0.freelist.zero[0];
      node->children[4] = pNVar6[uVar15].field_0.freelist.zero[7];
      uVar7 = *(undefined8 *)((long)&pNVar6[uVar15].field_0 + 0x10);
      *(undefined8 *)((long)&pNVar6[uVar15].field_0 + 4) =
           *(undefined8 *)((long)&pNVar6[uVar15].field_0 + 8);
      *(undefined8 *)((long)&pNVar6[uVar15].field_0 + 0xc) = uVar7;
      *(undefined8 *)((long)&pNVar6[uVar15].field_0 + 0x14) =
           *(undefined8 *)((long)&pNVar6[uVar15].field_0 + 0x18);
      pNVar6[uVar15].field_0.freelist.zero[6] = 0;
      uVar7 = *(undefined8 *)((long)&pNVar6[uVar15].field_0 + 0x24);
      uVar8 = *(undefined8 *)((long)&pNVar6[uVar15].field_0 + 0x2c);
      *(undefined8 *)((long)&pNVar6[uVar15].field_0 + 0x30) =
           *(undefined8 *)((long)&pNVar6[uVar15].field_0 + 0x34);
      *(undefined8 *)((long)&pNVar6[uVar15].field_0 + 0x20) = uVar7;
      *(undefined8 *)((long)&pNVar6[uVar15].field_0 + 0x28) = uVar8;
      pNVar6[uVar15].field_0.freelist.zero[0xd] = pNVar6[uVar15].field_0.freelist.zero[0xe];
      pNVar6[uVar15].field_0.freelist.zero[0xe] = 0;
      return node;
    }
    node->keys[6].i = pNVar6[uVar15].field_0.freelist.zero[2];
    *(undefined8 *)(node->keys + 4) = *(undefined8 *)((long)&pNVar6[uVar15].field_0 + 4);
    uVar7 = *(undefined8 *)((long)&pNVar6[uVar15].field_0 + 0x28);
    *(undefined8 *)(node->children + 4) = *(undefined8 *)((long)&pNVar6[uVar15].field_0 + 0x20);
    *(undefined8 *)(node->children + 6) = uVar7;
    uVar7 = *(undefined8 *)(parent->keys + 3);
    *(undefined8 *)(parent->keys + 4) = *(undefined8 *)(parent->keys + 5);
    *(undefined8 *)pMVar1 = *(undefined8 *)(parent->keys + 1);
    *(undefined8 *)(parent->keys + 2) = uVar7;
    parent->keys[6].i = 0;
    *(undefined8 *)(parent->children + 5) = *(undefined8 *)(parent->children + 6);
    *(undefined8 *)(parent->children + 1) = *(undefined8 *)(parent->children + 2);
    *(undefined8 *)(parent->children + 3) = *(undefined8 *)(parent->children + 4);
    parent->children[7] = 0;
    pNVar6 = this->tree;
    pNVar6[uVar15].field_0.freelist.nextOffset = ~uVar15 + this->freelistHead;
    puVar3 = (undefined8 *)((long)&pNVar6[uVar15].field_0 + 4);
    *puVar3 = 0;
    puVar3[1] = 0;
    puVar3 = (undefined8 *)((long)&pNVar6[uVar15].field_0 + 0x14);
    *puVar3 = 0;
    puVar3[1] = 0;
    puVar3 = (undefined8 *)((long)&pNVar6[uVar15].field_0 + 0x24);
    *puVar3 = 0;
    puVar3[1] = 0;
    puVar3 = (undefined8 *)((long)&pNVar6[uVar15].field_0 + 0x30);
    *puVar3 = 0;
    puVar3[1] = 0;
    this->freelistHead = uVar15;
    this->freelistSize = this->freelistSize + 1;
    if (*fixup == pMVar1) {
      *fixup = (MaybeUint *)0x0;
    }
    if (pMVar1->i != 0) {
      return node;
    }
    pNVar6 = this->tree;
    uVar7 = *(undefined8 *)node;
    uVar8 = *(undefined8 *)(node->keys + 1);
    uVar9 = *(undefined8 *)(node->keys + 3);
    uVar10 = *(undefined8 *)(node->keys + 5);
    uVar11 = *(undefined8 *)node->children;
    uVar12 = *(undefined8 *)(node->children + 2);
    uVar13 = *(undefined8 *)(node->children + 6);
    *(undefined8 *)((long)&pNVar6->field_0 + 0x30) = *(undefined8 *)(node->children + 4);
    *(undefined8 *)((long)&pNVar6->field_0 + 0x38) = uVar13;
    *(undefined8 *)((long)&pNVar6->field_0 + 0x20) = uVar11;
    *(undefined8 *)((long)&pNVar6->field_0 + 0x28) = uVar12;
    *(undefined8 *)((long)&pNVar6->field_0 + 0x10) = uVar9;
    *(undefined8 *)((long)&pNVar6->field_0 + 0x18) = uVar10;
    *(undefined8 *)&pNVar6->field_0 = uVar7;
    *(undefined8 *)((long)&pNVar6->field_0 + 8) = uVar8;
    pNVar6 = this->tree;
    pNVar6[pos].field_0.freelist.nextOffset = ~pos + this->freelistHead;
    puVar3 = (undefined8 *)((long)&pNVar6[pos].field_0 + 4);
    *puVar3 = 0;
    puVar3[1] = 0;
    puVar3 = (undefined8 *)((long)&pNVar6[pos].field_0 + 0x14);
    *puVar3 = 0;
    puVar3[1] = 0;
    puVar3 = (undefined8 *)((long)&pNVar6[pos].field_0 + 0x24);
    *puVar3 = 0;
    puVar3[1] = 0;
    puVar3 = (undefined8 *)((long)&pNVar6[pos].field_0 + 0x30);
    *puVar3 = 0;
    puVar3[1] = 0;
    this->freelistHead = pos;
  }
  else {
    uVar14 = (ulong)(indexInParent - 1);
    uVar15 = parent->children[uVar14];
    pPVar2 = (Parent *)(this->tree + uVar15);
    if (this->tree[uVar15].field_0.freelist.zero[3] != 0) {
      node->keys[3].i = node->keys[2].i;
      *(undefined8 *)(node->keys + 1) = *(undefined8 *)node->keys;
      *(undefined8 *)(node->children + 1) = *(undefined8 *)node->children;
      *(undefined8 *)(node->children + 3) = *(undefined8 *)(node->children + 2);
      bVar17 = pPVar2->keys[3].i != 0;
      uVar15 = (uint)bVar17 * 4 + (uint)(pPVar2->keys[(ulong)bVar17 * 4 + 1].i != 0) * 2;
      bVar17 = pPVar2->keys[uVar15].i != 0;
      uVar16 = (bVar17 + uVar15) - 1;
      uVar15 = uVar15 | bVar17;
      node->keys[0].i = parent->keys[uVar14].i;
      parent->keys[uVar14].i = pPVar2->keys[uVar16].i;
      node->children[0] = pPVar2->children[uVar15];
      pPVar2->keys[uVar16].i = 0;
      pPVar2->children[uVar15] = 0;
      return node;
    }
    pPVar2->keys[3].i = parent->keys[uVar14].i;
    *(undefined8 *)(pPVar2->keys + 4) = *(undefined8 *)node->keys;
    pPVar2->keys[6].i = node->keys[2].i;
    uVar7 = *(undefined8 *)(node->children + 2);
    *(undefined8 *)(pPVar2->children + 4) = *(undefined8 *)node->children;
    *(undefined8 *)(pPVar2->children + 6) = uVar7;
    memmove(parent->keys + uVar14,parent->keys + uVar14 + 1,(ulong)indexInParent * -4 + 0x1c);
    parent->keys[6].i = 0;
    memmove(parent->children + uVar14 + 1,parent->children + uVar14 + 2,
            (ulong)(indexInParent + 1) * -4 + 0x20);
    parent->children[7] = 0;
    pNVar6 = this->tree;
    pNVar6[pos].field_0.freelist.nextOffset = ~pos + this->freelistHead;
    puVar3 = (undefined8 *)((long)&pNVar6[pos].field_0 + 4);
    *puVar3 = 0;
    puVar3[1] = 0;
    puVar3 = (undefined8 *)((long)&pNVar6[pos].field_0 + 0x14);
    *puVar3 = 0;
    puVar3[1] = 0;
    puVar3 = (undefined8 *)((long)&pNVar6[pos].field_0 + 0x24);
    *puVar3 = 0;
    puVar3[1] = 0;
    puVar3 = (undefined8 *)((long)&pNVar6[pos].field_0 + 0x30);
    *puVar3 = 0;
    puVar3[1] = 0;
    this->freelistHead = pos;
    this->freelistSize = this->freelistSize + 1;
    if (*fixup == parent->keys + indexInParent) {
      *fixup = *fixup + -1;
    }
    if (parent->keys[0].i != 0) {
      return pPVar2;
    }
    pNVar6 = this->tree;
    uVar7 = *(undefined8 *)pPVar2;
    uVar8 = *(undefined8 *)(pPVar2->keys + 1);
    uVar9 = *(undefined8 *)(pPVar2->keys + 3);
    uVar10 = *(undefined8 *)(pPVar2->keys + 5);
    uVar11 = *(undefined8 *)pPVar2->children;
    uVar12 = *(undefined8 *)(pPVar2->children + 2);
    uVar13 = *(undefined8 *)(pPVar2->children + 6);
    *(undefined8 *)((long)&pNVar6->field_0 + 0x30) = *(undefined8 *)(pPVar2->children + 4);
    *(undefined8 *)((long)&pNVar6->field_0 + 0x38) = uVar13;
    *(undefined8 *)((long)&pNVar6->field_0 + 0x20) = uVar11;
    *(undefined8 *)((long)&pNVar6->field_0 + 0x28) = uVar12;
    *(undefined8 *)((long)&pNVar6->field_0 + 0x10) = uVar9;
    *(undefined8 *)((long)&pNVar6->field_0 + 0x18) = uVar10;
    *(undefined8 *)&pNVar6->field_0 = uVar7;
    *(undefined8 *)((long)&pNVar6->field_0 + 8) = uVar8;
    pNVar6 = this->tree;
    pNVar6[uVar15].field_0.freelist.nextOffset = ~uVar15 + this->freelistHead;
    puVar3 = (undefined8 *)((long)&pNVar6[uVar15].field_0 + 4);
    *puVar3 = 0;
    puVar3[1] = 0;
    puVar3 = (undefined8 *)((long)&pNVar6[uVar15].field_0 + 0x14);
    *puVar3 = 0;
    puVar3[1] = 0;
    puVar3 = (undefined8 *)((long)&pNVar6[uVar15].field_0 + 0x24);
    *puVar3 = 0;
    puVar3[1] = 0;
    puVar3 = (undefined8 *)((long)&pNVar6[uVar15].field_0 + 0x30);
    *puVar3 = 0;
    puVar3[1] = 0;
    this->freelistHead = uVar15;
  }
  this->freelistSize = this->freelistSize + 1;
  this->height = this->height - 1;
  return (Parent *)this->tree;
}

Assistant:

Node& BTreeImpl::eraseHelper(
    Node& node, Parent* parent, uint indexInParent, uint pos, MaybeUint*& fixup) {
  if (parent != nullptr && !node.isMostlyFull()) {
    // This is not the root, but it's only half-full. Rebalance.
    KJ_DASSERT(node.isHalfFull());

    if (indexInParent > 0) {
      // There's a sibling to the left.
      uint sibPos = parent->children[indexInParent - 1];
      Node& sib = tree[sibPos];
      if (sib.isMostlyFull()) {
        // Left sibling is more than half full. Steal one member.
        rotateRight(sib, node, *parent, indexInParent - 1);
        return node;
      } else {
        // Left sibling is half full, too. Merge.
        KJ_ASSERT(sib.isHalfFull());
        merge(sib, sibPos, *parent->keys[indexInParent - 1], node);
        parent->eraseAfter(indexInParent - 1);
        free(pos);
        if (fixup == &parent->keys[indexInParent]) --fixup;

        if (parent->keys[0] == nullptr) {
          // Oh hah, the parent has no keys left. It must be the root. We can eliminate it.
          KJ_DASSERT(parent == &tree->parent);
          compilerBarrier();  // don't reorder any writes to parent below here
          move(tree[0], 0, sib);
          free(sibPos);
          --height;
          return tree[0];
        } else {
          return sib;
        }
      }
    } else if (indexInParent < Parent::NKEYS && parent->keys[indexInParent] != nullptr) {
      // There's a sibling to the right.
      uint sibPos = parent->children[indexInParent + 1];
      Node& sib = tree[sibPos];
      if (sib.isMostlyFull()) {
        // Right sibling is more than half full. Steal one member.
        rotateLeft(node, sib, *parent, indexInParent, fixup);
        return node;
      } else {
        // Right sibling is half full, too. Merge.
        KJ_ASSERT(sib.isHalfFull());
        merge(node, pos, *parent->keys[indexInParent], sib);
        parent->eraseAfter(indexInParent);
        free(sibPos);
        if (fixup == &parent->keys[indexInParent]) fixup = nullptr;

        if (parent->keys[0] == nullptr) {
          // Oh hah, the parent has no keys left. It must be the root. We can eliminate it.
          KJ_DASSERT(parent == &tree->parent);
          compilerBarrier();  // don't reorder any writes to parent below here
          move(tree[0], 0, node);
          free(pos);
          --height;
          return tree[0];
        } else {
          return node;
        }
      }
    } else {
      KJ_FAIL_ASSERT("inconsistent b-tree");
    }
  }

  return node;
}